

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
::Visit<google::protobuf::EnumDescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
           *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  EnumValueDescriptor *pEVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *proto_00;
  long lVar2;
  long lVar3;
  
  if ((descriptor->merged_features_->field_0)._impl_.enforce_naming_style_ == 1) {
    DescriptorBuilder::
    ValidateNamingStyle<google::protobuf::EnumDescriptor,google::protobuf::EnumDescriptorProto>
              (*(DescriptorBuilder **)this,descriptor,proto);
  }
  if (0 < descriptor->value_count_) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      pEVar1 = descriptor->values_;
      proto_00 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                           (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,(int)lVar3);
      if (*(int *)(*(long *)((long)&pEVar1->merged_features_ + lVar2) + 0x48) == 1) {
        DescriptorBuilder::
        ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>
                  (*(DescriptorBuilder **)this,
                   (EnumValueDescriptor *)(&pEVar1->super_SymbolBaseN<0> + lVar2),proto_00);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x30;
    } while (lVar3 < descriptor->value_count_);
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }